

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

Aig_Obj_t * Saig_BmcObjChild0(Saig_Bmc_t *p,Aig_Obj_t *pObj,int i)

{
  Aig_Obj_t *pAVar1;
  
  if (((ulong)pObj & 1) == 0) {
    pAVar1 = Saig_BmcObjFrame(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),i);
    return (Aig_Obj_t *)((ulong)pAVar1 ^ (ulong)((uint)pObj->pFanin0 & 1));
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc2.c"
                ,0x61,"Aig_Obj_t *Saig_BmcObjChild0(Saig_Bmc_t *, Aig_Obj_t *, int)");
}

Assistant:

static inline Aig_Obj_t * Saig_BmcObjChild0( Saig_Bmc_t * p, Aig_Obj_t * pObj, int i )                   { assert( !Aig_IsComplement(pObj) ); return Aig_NotCond(Saig_BmcObjFrame(p, Aig_ObjFanin0(pObj), i), Aig_ObjFaninC0(pObj));  }